

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Import_&> __thiscall
capnp::_::anon_unknown_18::
ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Import>::find
          (ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Import> *this,
          uint id)

{
  uint in_EDX;
  undefined4 in_register_00000034;
  long lVar1;
  
  lVar1 = CONCAT44(in_register_00000034,id);
  if (in_EDX < 0x10) {
    if ((*(uint *)(lVar1 + 0x200) >> (in_EDX & 0x1f) & 1) == 0) {
      this->low[0].importClient.ptr = (ImportClient *)0x0;
    }
    else {
      this->low[0].importClient.ptr = (ImportClient *)(lVar1 + (ulong)in_EDX * 0x20);
    }
  }
  else {
    kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import>::
    find<unsigned_int&>((HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Import> *
                        )this,(uint *)(lVar1 + 0x208));
  }
  return (Maybe<capnp::_::RpcSystemBase::RpcConnectionState::Import_&>)this->low;
}

Assistant:

kj::Maybe<T&> find(Id id) {
    // Look up an entry, returning null if it doesn't exist.
    if (id < kj::size(low)) {
      if (presenceBits & (1 << id)) {
        return low[id];
      } else {
        return kj::none;
      }
    } else {
      return high.find(id);
    }
  }